

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

void __thiscall
soplex::SPxSolverBase<double>::getEnterVals
          (SPxSolverBase<double> *this,SPxId enterId,double *enterTest,double *enterUB,
          double *enterLB,double *enterVal,double *enterMax,double *enterPric,Status *enterStat,
          double *enterRO,StableSum<double> *objChange)

{
  pointer pdVar1;
  double dVar2;
  Real RVar3;
  int iVar4;
  Status SVar5;
  double *pdVar6;
  Status *pSVar7;
  pointer pdVar8;
  undefined8 *puVar9;
  long lVar10;
  ulong uVar11;
  undefined4 uVar12;
  uint uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_68;
  DataKey local_58;
  long local_50;
  undefined1 local_48 [16];
  DataKey local_38;
  
  local_38 = enterId.super_DataKey;
  if (enterId.super_DataKey.info < 1) {
    SPxRowId::SPxRowId((SPxRowId *)&local_58,(SPxId *)&local_38);
    iVar4 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set,&local_58);
    lVar10 = (long)iVar4;
    SVar5 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar10];
    *enterStat = SVar5;
    if (this->theRep == ROW) {
      computePvec(this,iVar4);
      dVar2 = computeTest(this,iVar4);
      *enterTest = dVar2;
      (this->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar10] = 0.0;
      SVar5 = *enterStat;
    }
    else {
      pdVar1 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      *enterTest = pdVar1[lVar10];
      pdVar1[lVar10] = 0.0;
    }
    switch(SVar5) {
    case D_FREE:
      ::soplex::infinity::__tls_init();
      pdVar6 = (double *)__tls_get_addr(&PTR_003b4b70);
      dVar2 = *pdVar6;
      *enterUB = dVar2;
      ::soplex::infinity::__tls_init();
      *enterLB = -dVar2;
      *enterVal = 0.0;
      *enterPric = (this->thePvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
      dVar16 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar10];
      *enterRO = dVar16;
      uVar11 = -(ulong)(dVar16 < *enterPric);
      ::soplex::infinity::__tls_init();
      *enterMax = (double)(~uVar11 & (ulong)-dVar2 | (ulong)dVar2 & uVar11);
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      goto LAB_001e5c91;
    case D_ON_UPPER:
      *enterUB = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      ::soplex::infinity::__tls_init();
      pdVar6 = (double *)__tls_get_addr(&PTR_003b4b70);
      local_68 = -*pdVar6;
      *enterLB = -*pdVar6;
      *enterVal = *enterUB;
      ::soplex::infinity::__tls_init();
      *enterMax = local_68;
      *enterPric = (this->thePvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
      dVar2 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar10];
      *enterRO = dVar2;
      dVar2 = dVar2 * *enterVal;
      dVar16 = objChange->sum;
      dVar15 = dVar16 - dVar2;
      objChange->c = (-dVar2 - (dVar15 - dVar16)) + (dVar16 - (dVar15 - (dVar15 - dVar16))) +
                     objChange->c;
      objChange->sum = dVar15;
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      goto LAB_001e5e2c;
    case D_ON_LOWER:
      *enterLB = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      ::soplex::infinity::__tls_init();
      pdVar6 = (double *)__tls_get_addr(&PTR_003b4b70);
      dVar2 = *pdVar6;
      *enterUB = dVar2;
      *enterVal = *enterLB;
      ::soplex::infinity::__tls_init();
      *enterMax = dVar2;
      *enterPric = (this->thePvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
      dVar2 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar10];
      *enterRO = dVar2;
      dVar2 = dVar2 * *enterVal;
      dVar16 = objChange->sum;
      dVar15 = dVar16 - dVar2;
      objChange->c = (-dVar2 - (dVar15 - dVar16)) + (dVar16 - (dVar15 - (dVar15 - dVar16))) +
                     objChange->c;
      objChange->sum = dVar15;
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      goto LAB_001e5d5d;
    case D_ON_BOTH:
      dVar2 = (this->thePvec->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar10];
      *enterPric = dVar2;
      pdVar6 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar10;
      if (dVar2 < *pdVar6 || dVar2 == *pdVar6) {
        dVar2 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        *enterUB = dVar2;
        *enterVal = dVar2;
        ::soplex::infinity::__tls_init();
        pdVar6 = (double *)__tls_get_addr(&PTR_003b4b70);
        dVar2 = *pdVar6;
        *enterLB = -dVar2;
        ::soplex::infinity::__tls_init();
        pdVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        *enterMax = -dVar2;
        pdVar8 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        *enterRO = pdVar8[lVar10];
        (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar10] = P_ON_LOWER;
        dVar2 = pdVar1[lVar10];
        uVar12 = SUB84(dVar2,0);
        uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
      }
      else {
        dVar2 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        *enterLB = dVar2;
        *enterVal = dVar2;
        ::soplex::infinity::__tls_init();
        pdVar6 = (double *)__tls_get_addr(&PTR_003b4b70);
        dVar2 = *pdVar6;
        *enterUB = dVar2;
        ::soplex::infinity::__tls_init();
        pdVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        *enterMax = dVar2;
        dVar2 = pdVar1[lVar10];
        uVar12 = SUB84(dVar2,0);
        uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
        *enterRO = dVar2;
        (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar10] = P_ON_UPPER;
        pdVar8 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      }
      dVar16 = (double)CONCAT44(uVar14,uVar12) *
               (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10];
      dVar2 = objChange->sum;
      dVar15 = dVar2 - dVar16;
      dVar2 = (-dVar16 - (dVar15 - dVar2)) + (dVar2 - (dVar15 - (dVar15 - dVar2))) + objChange->c;
      objChange->c = dVar2;
      objChange->sum = dVar15;
      dVar16 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10] * pdVar8[lVar10];
      dVar17 = dVar15 - dVar16;
      objChange->c = (-dVar16 - (dVar17 - dVar15)) + (dVar15 - (dVar17 - (dVar17 - dVar15))) + dVar2
      ;
      objChange->sum = dVar17;
      return;
    case P_ON_LOWER:
      *enterUB = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      *enterLB = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      dVar2 = *enterUB;
      *enterVal = dVar2;
      *enterMax = *enterLB - dVar2;
      *enterPric = (this->theCoPvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
      dVar2 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar10];
      *enterRO = dVar2;
      dVar2 = dVar2 * *enterVal;
      dVar16 = objChange->sum;
      dVar15 = dVar16 - dVar2;
      objChange->c = (-dVar2 - (dVar15 - dVar16)) + (dVar16 - (dVar15 - (dVar15 - dVar16))) +
                     objChange->c;
      objChange->sum = dVar15;
      dVar2 = *enterLB;
      ::soplex::infinity::__tls_init();
      pdVar6 = (double *)__tls_get_addr(&PTR_003b4b70);
      if (dVar2 <= -*pdVar6) {
        pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
        goto LAB_001e5200;
      }
      break;
    default:
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_58 = (DataKey)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"XENTER03 This should never happen.","");
      *puVar9 = &PTR__SPxException_003adbd8;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
      *puVar9 = &PTR__SPxException_003ae9a0;
      __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_UPPER:
      *enterUB = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      dVar2 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10];
      *enterLB = dVar2;
      *enterVal = dVar2;
      *enterMax = *enterUB - *enterLB;
      *enterPric = (this->theCoPvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10];
      dVar2 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar10];
      *enterRO = dVar2;
      dVar2 = dVar2 * *enterVal;
      dVar16 = objChange->sum;
      dVar15 = dVar16 - dVar2;
      objChange->c = (-dVar2 - (dVar15 - dVar16)) + (dVar16 - (dVar15 - (dVar15 - dVar16))) +
                     objChange->c;
      objChange->sum = dVar15;
      dVar2 = *enterUB;
      ::soplex::infinity::__tls_init();
      pdVar6 = (double *)__tls_get_addr(&PTR_003b4b70);
      if (*pdVar6 <= dVar2) {
        pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
        goto LAB_001e5b76;
      }
      break;
    case P_FREE:
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_58 = (DataKey)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"XENTER02 This should never happen.","");
      *puVar9 = &PTR__SPxException_003adbd8;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
      *puVar9 = &PTR__SPxException_003ae9a0;
      __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    dVar2 = *enterLB;
    dVar16 = *enterUB;
    RVar3 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
    if (ABS(dVar2 - dVar16) <= RVar3) goto LAB_001e5704;
    goto LAB_001e53ab;
  }
  SPxColId::SPxColId((SPxColId *)&local_58,(SPxId *)&local_38);
  iVar4 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                    (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                      super_SVSetBase<double>.set,&local_58);
  lVar10 = (long)iVar4;
  SVar5 = (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar10];
  *enterStat = SVar5;
  if (this->theRep == COLUMN) {
    computePvec(this,iVar4);
    dVar2 = computeTest(this,iVar4);
    *enterTest = dVar2;
    (this->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar10] = 0.0;
    SVar5 = *enterStat;
  }
  else {
    pdVar1 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    *enterTest = pdVar1[lVar10];
    pdVar1[lVar10] = 0.0;
  }
  switch(SVar5) {
  case D_FREE:
    ::soplex::infinity::__tls_init();
    pdVar6 = (double *)__tls_get_addr(&PTR_003b4b70);
    dVar2 = *pdVar6;
    *enterUB = dVar2;
    ::soplex::infinity::__tls_init();
    *enterLB = -dVar2;
    *enterVal = 0.0;
    *enterRO = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar10];
    dVar16 = (this->theCoPvec->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar10];
    *enterPric = dVar16;
    uVar11 = -(ulong)(*enterRO < dVar16);
    ::soplex::infinity::__tls_init();
    *enterMax = (double)(~uVar11 & (ulong)-dVar2 | (ulong)dVar2 & uVar11);
    pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001e5c91:
    pSVar7[lVar10] = P_FIXED;
    break;
  case D_ON_UPPER:
    *enterUB = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10];
    ::soplex::infinity::__tls_init();
    pdVar6 = (double *)__tls_get_addr(&PTR_003b4b70);
    dVar2 = *pdVar6;
    *enterLB = -dVar2;
    ::soplex::infinity::__tls_init();
    *enterMax = -dVar2;
    *enterVal = *enterUB;
    *enterPric = (this->theCoPvec->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar10];
    dVar2 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar10];
    *enterRO = dVar2;
    dVar2 = dVar2 * *enterVal;
    dVar16 = objChange->sum;
    dVar15 = dVar16 - dVar2;
    objChange->c = (-dVar2 - (dVar15 - dVar16)) + (dVar16 - (dVar15 - (dVar15 - dVar16))) +
                   objChange->c;
    objChange->sum = dVar15;
    pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001e5e2c:
    pSVar7[lVar10] = P_ON_LOWER;
    break;
  case D_ON_LOWER:
    *enterLB = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10];
    ::soplex::infinity::__tls_init();
    pdVar6 = (double *)__tls_get_addr(&PTR_003b4b70);
    dVar2 = *pdVar6;
    *enterUB = dVar2;
    ::soplex::infinity::__tls_init();
    *enterMax = dVar2;
    *enterVal = *enterLB;
    *enterPric = (this->theCoPvec->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar10];
    dVar2 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar10];
    *enterRO = dVar2;
    dVar2 = dVar2 * *enterVal;
    dVar16 = objChange->sum;
    dVar15 = dVar16 - dVar2;
    objChange->c = (-dVar2 - (dVar15 - dVar16)) + (dVar16 - (dVar15 - (dVar15 - dVar16))) +
                   objChange->c;
    objChange->sum = dVar15;
    pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001e5d5d:
    pSVar7[lVar10] = P_ON_UPPER;
    break;
  case D_ON_BOTH:
    dVar2 = (this->theCoPvec->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar10];
    *enterPric = dVar2;
    pdVar6 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start + lVar10;
    if (dVar2 < *pdVar6 || dVar2 == *pdVar6) {
      dVar2 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10];
      *enterUB = dVar2;
      *enterVal = dVar2;
      *enterRO = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar10];
      ::soplex::infinity::__tls_init();
      pdVar6 = (double *)__tls_get_addr(&PTR_003b4b70);
      dVar2 = *pdVar6;
      *enterLB = -dVar2;
      ::soplex::infinity::__tls_init();
      pdVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      *enterMax = -dVar2;
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar10] = P_ON_LOWER;
      dVar2 = pdVar1[lVar10];
      uVar12 = SUB84(dVar2,0);
      uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    else {
      *enterLB = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      ::soplex::infinity::__tls_init();
      pdVar6 = (double *)__tls_get_addr(&PTR_003b4b70);
      dVar2 = *pdVar6;
      *enterUB = dVar2;
      ::soplex::infinity::__tls_init();
      pdVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      *enterMax = dVar2;
      *enterVal = *enterLB;
      dVar2 = pdVar1[lVar10];
      uVar12 = SUB84(dVar2,0);
      uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
      *enterRO = dVar2;
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar10] = P_ON_UPPER;
    }
    dVar16 = (double)CONCAT44(uVar14,uVar12) *
             (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar10];
    dVar2 = objChange->sum;
    dVar15 = dVar2 - dVar16;
    dVar2 = (-dVar16 - (dVar15 - dVar2)) + (dVar2 - (dVar15 - (dVar15 - dVar2))) + objChange->c;
    objChange->c = dVar2;
    objChange->sum = dVar15;
    dVar16 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar10] *
             (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar10];
    dVar17 = dVar15 - dVar16;
    objChange->c = (-dVar16 - (dVar17 - dVar15)) + (dVar15 - (dVar17 - (dVar17 - dVar15))) + dVar2;
    objChange->sum = dVar17;
    break;
  case P_ON_LOWER:
    *enterUB = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10];
    dVar2 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10];
    *enterLB = dVar2;
    *enterVal = dVar2;
    *enterMax = *enterUB - *enterLB;
    *enterPric = (this->thePvec->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar10];
    dVar2 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar10];
    *enterRO = dVar2;
    dVar2 = dVar2 * *enterVal;
    dVar16 = objChange->sum;
    dVar15 = dVar16 - dVar2;
    objChange->c = (-dVar2 - (dVar15 - dVar16)) + (dVar16 - (dVar15 - (dVar15 - dVar16))) +
                   objChange->c;
    objChange->sum = dVar15;
    dVar2 = *enterUB;
    ::soplex::infinity::__tls_init();
    pdVar6 = (double *)__tls_get_addr(&PTR_003b4b70);
    if (*pdVar6 <= dVar2) {
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001e5200:
      pSVar7[lVar10] = D_ON_UPPER;
      return;
    }
    goto LAB_001e5371;
  default:
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_58 = (DataKey)local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"XENTER01 This should never happen.","");
    *puVar9 = &PTR__SPxException_003adbd8;
    puVar9[1] = puVar9 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar9 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
    *puVar9 = &PTR__SPxException_003ae9a0;
    __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_UPPER:
    *enterUB = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10];
    *enterLB = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10];
    dVar2 = *enterUB;
    *enterVal = dVar2;
    *enterMax = *enterLB - dVar2;
    *enterPric = (this->thePvec->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar10];
    dVar2 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar10];
    *enterRO = dVar2;
    dVar2 = dVar2 * *enterVal;
    dVar16 = objChange->sum;
    dVar15 = dVar16 - dVar2;
    objChange->c = (-dVar2 - (dVar15 - dVar16)) + (dVar16 - (dVar15 - (dVar15 - dVar16))) +
                   objChange->c;
    objChange->sum = dVar15;
    dVar2 = *enterLB;
    ::soplex::infinity::__tls_init();
    pdVar6 = (double *)__tls_get_addr(&PTR_003b4b70);
    if (dVar2 <= -*pdVar6) {
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001e5b76:
      pSVar7[lVar10] = D_ON_LOWER;
      return;
    }
LAB_001e5371:
    dVar2 = *enterLB;
    dVar16 = *enterUB;
    RVar3 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
    if (ABS(dVar2 - dVar16) <= RVar3) {
LAB_001e5704:
      pSVar7[lVar10] = D_FREE;
    }
    else {
LAB_001e53ab:
      pSVar7[lVar10] = D_ON_BOTH;
    }
    break;
  case P_FREE:
    *enterUB = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10];
    *enterLB = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10];
    *enterVal = 0.0;
    *enterPric = (this->thePvec->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar10];
    dVar2 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar10];
    *enterRO = dVar2;
    (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar10] = D_UNDEFINED;
    if (dVar2 < *enterPric || dVar2 == *enterPric) {
      ::soplex::infinity::__tls_init();
      puVar9 = (undefined8 *)__tls_get_addr(&PTR_003b4b70);
      uVar13 = (uint)((ulong)*puVar9 >> 0x20) ^ 0x80000000;
      uVar12 = (undefined4)*puVar9;
    }
    else {
      ::soplex::infinity::__tls_init();
      puVar9 = (undefined8 *)__tls_get_addr(&PTR_003b4b70);
      uVar12 = (undefined4)*puVar9;
      uVar13 = (uint)((ulong)*puVar9 >> 0x20);
    }
    *enterMax = (double)CONCAT44(uVar13,uVar12);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::getEnterVals
(
   SPxId enterId,
   R& enterTest,
   R& enterUB,
   R& enterLB,
   R& enterVal,
   R& enterMax,
   R& enterPric,
   typename SPxBasisBase<R>::Desc::Status& enterStat,
   R& enterRO,
   StableSum<R>& objChange
)
{
   int enterIdx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(enterId.isSPxColId())
   {
      enterIdx = this->number(SPxColId(enterId));
      enterStat = ds.colStatus(enterIdx);
      assert(!isBasic(enterStat));

      /*      For an #Id# to enter the basis we better recompute the Test value.
       */
      if(rep() == COLUMN)
      {
         computePvec(enterIdx);
         enterTest = computeTest(enterIdx);
         theTest[enterIdx] = 0;
      }
      else
      {
         enterTest = coTest()[enterIdx];
         theCoTest[enterIdx] = 0;
      }

      switch(enterStat)
      {
      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = enterUB;
         enterMax = enterLB - enterUB;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         objChange -= enterVal * enterRO;

         if(enterLB <= R(-infinity))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_LOWER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = enterLB;
         enterMax = enterUB - enterLB;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         objChange -= enterVal * enterRO;

         if(enterUB >= R(infinity))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_UPPER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = 0;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
         enterMax = (enterRO - enterPric > 0) ? R(infinity) : R(-infinity);
         break;

      // dual/rowwise cases:
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         assert(theUCbound[enterIdx] < R(infinity));
         enterUB = theUCbound[enterIdx];
         enterLB = R(-infinity);
         enterMax = R(-infinity);
         enterVal = enterUB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = SPxLPBase<R>::lower(enterIdx);
         objChange -= enterRO * enterVal;
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         assert(theLCbound[enterIdx] > R(-infinity));
         enterLB = theLCbound[enterIdx];
         enterUB = R(infinity);
         enterMax = R(infinity);
         enterVal = enterLB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = SPxLPBase<R>::upper(enterIdx);
         objChange -= enterRO * enterVal;
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_FREE:
         assert(rep() == ROW);
         assert(SPxLPBase<R>::lower(enterIdx) == SPxLPBase<R>::upper(enterIdx));
         enterUB = R(infinity);
         enterLB = R(-infinity);
         enterVal = 0;
         enterRO = SPxLPBase<R>::upper(enterIdx);
         enterPric = (*theCoPvec)[enterIdx];

         if(enterPric > enterRO)
            enterMax = R(infinity);
         else
            enterMax = R(-infinity);

         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);
         enterPric = (*theCoPvec)[enterIdx];

         if(enterPric > SPxLPBase<R>::upper(enterIdx))
         {
            enterLB = theLCbound[enterIdx];
            enterUB = R(infinity);
            enterMax = R(infinity);
            enterVal = enterLB;
            enterRO = SPxLPBase<R>::upper(enterIdx);
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            enterUB = theUCbound[enterIdx];
            enterVal = enterUB;
            enterRO = SPxLPBase<R>::lower(enterIdx);
            enterLB = R(-infinity);
            enterMax = R(-infinity);
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         objChange -= theLCbound[enterIdx] * SPxLPBase<R>::upper(enterIdx);
         objChange -= theUCbound[enterIdx] * SPxLPBase<R>::lower(enterIdx);
         break;

      default:
         throw SPxInternalCodeException("XENTER01 This should never happen.");
      }

      SPxOut::debug(this, "DENTER03 SPxSolverBase::getEnterVals() : col {}: {} -> {} objChange: {}\n",
                    enterIdx, enterStat, ds.colStatus(enterIdx), objChange);
   }

   else
   {
      assert(enterId.isSPxRowId());
      enterIdx = this->number(SPxRowId(enterId));
      enterStat = ds.rowStatus(enterIdx);
      assert(!isBasic(enterStat));

      /*      For an #Id# to enter the basis we better recompute the Test value.
       */
      if(rep() == ROW)
      {
         computePvec(enterIdx);
         enterTest = computeTest(enterIdx);
         theTest[enterIdx] = 0;
      }
      else
      {
         enterTest = coTest()[enterIdx];
         theCoTest[enterIdx] = 0;
      }

      switch(enterStat)
      {
      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         enterUB = theURbound[enterIdx];
         enterLB = theLRbound[enterIdx];
         enterVal = enterLB;
         enterMax = enterUB - enterLB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         objChange -= enterRO * enterVal;

         if(enterUB >= R(infinity))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_LOWER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         enterUB = theURbound[enterIdx];
         enterLB = theLRbound[enterIdx];
         enterVal = enterUB;
         enterMax = enterLB - enterUB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         objChange -= enterRO * enterVal;

         if(enterLB <= R(-infinity))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_UPPER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
#if 1
         throw SPxInternalCodeException("XENTER02 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "EENTER99 ERROR: not yet debugged!" << std::endl;)
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
#endif
         break;

      // dual/rowwise cases:
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         assert(theURbound[enterIdx] < R(infinity));
         enterUB = theURbound[enterIdx];
         enterLB = R(-infinity);
         enterVal = enterUB;
         enterMax = R(-infinity);
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->lhs(enterIdx);
         objChange -= enterRO * enterVal;
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         assert(theLRbound[enterIdx] > R(-infinity));
         enterLB = theLRbound[enterIdx];
         enterUB = R(infinity);
         enterVal = enterLB;
         enterMax = R(infinity);
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->rhs(enterIdx);
         objChange -= enterRO * enterVal;
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_FREE:
         assert(rep() == ROW);
         assert(this->rhs(enterIdx) == this->lhs(enterIdx));
         enterUB = R(infinity);
         enterLB = R(-infinity);
         enterVal = 0;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->rhs(enterIdx);
         enterMax = (enterPric > enterRO) ? R(infinity) : R(-infinity);
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);
         enterPric = (*thePvec)[enterIdx];

         if(enterPric > this->rhs(enterIdx))
         {
            enterLB = theLRbound[enterIdx];
            enterVal = enterLB;
            enterUB = R(infinity);
            enterMax = R(infinity);
            enterRO = this->rhs(enterIdx);
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            enterUB = theURbound[enterIdx];
            enterVal = enterUB;
            enterLB = R(-infinity);
            enterMax = R(-infinity);
            enterRO = this->lhs(enterIdx);
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         objChange -= theLRbound[enterIdx] * this->rhs(enterIdx);
         objChange -= theURbound[enterIdx] * this->lhs(enterIdx);
         break;

      default:
         throw SPxInternalCodeException("XENTER03 This should never happen.");
      }

      SPxOut::debug(this, "DENTER05 SPxSolverBase::getEnterVals() : row {}: {} -> {} objChange: {}\n",
                    enterIdx, enterStat, ds.rowStatus(enterIdx), objChange);
   }
}